

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# video_reader.c
# Opt level: O0

int aom_video_reader_read_frame(AvxVideoReader *reader)

{
  int iVar1;
  long in_RDI;
  size_t *in_stack_00000010;
  size_t *in_stack_00000018;
  uint8_t **in_stack_00000020;
  AvxInputContext *in_stack_00000028;
  size_t *in_stack_00000040;
  size_t *in_stack_00000048;
  uint8_t **in_stack_00000050;
  WebmInputContext *in_stack_00000058;
  size_t *in_stack_00000070;
  size_t *in_stack_00000078;
  uint8_t **in_stack_00000080;
  ObuDecInputContext *in_stack_00000088;
  undefined4 local_4;
  
  if (*(int *)(in_RDI + 0x68) == 2) {
    iVar1 = ivf_read_frame(in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
                           (aom_codec_pts_t *)reader);
    local_4 = (uint)((iVar1 != 0 ^ 0xffU) & 1);
  }
  else if (*(int *)(in_RDI + 0x68) == 0) {
    iVar1 = obudec_read_temporal_unit
                      (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000070);
    local_4 = (uint)((iVar1 != 0 ^ 0xffU) & 1);
  }
  else if (*(int *)(in_RDI + 0x68) == 4) {
    iVar1 = webm_read_frame(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040)
    ;
    local_4 = (uint)((iVar1 != 0 ^ 0xffU) & 1);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int aom_video_reader_read_frame(AvxVideoReader *reader) {
  if (reader->input_ctx.file_type == FILE_TYPE_IVF) {
    return !ivf_read_frame(&reader->input_ctx, &reader->buffer,
                           &reader->frame_size, &reader->buffer_size,
                           &reader->pts);
  } else if (reader->input_ctx.file_type == FILE_TYPE_OBU) {
    return !obudec_read_temporal_unit(&reader->obu_ctx, &reader->buffer,
                                      &reader->frame_size,
                                      &reader->buffer_size);
#if CONFIG_WEBM_IO
  } else if (reader->input_ctx.file_type == FILE_TYPE_WEBM) {
    return !webm_read_frame(&reader->webm_ctx, &reader->buffer,
                            &reader->frame_size, &reader->buffer_size);
#endif
  } else {
    assert(0);
    return 0;
  }
}